

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_column_data.cpp
# Opt level: O2

idx_t __thiscall
duckdb::StructColumnData::Scan
          (StructColumnData *this,TransactionData transaction,idx_t vector_index,
          ColumnScanState *state,Vector *result,idx_t target_count)

{
  ulong __n;
  reference pvVar1;
  idx_t iVar2;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_00;
  reference this_01;
  type this_02;
  reference this_03;
  pointer pCVar3;
  size_type __n_00;
  reference rVar4;
  
  pvVar1 = vector<duckdb::ColumnScanState,_true>::get<true>(&state->child_states,0);
  iVar2 = ColumnData::ScanVector
                    (&(this->validity).super_ColumnData,transaction,vector_index,pvVar1,result,
                     target_count,REGULAR_SCAN);
  this_00 = StructVector::GetEntries(result);
  for (__n_00 = 1; __n = __n_00 - 1,
      __n < (ulong)((long)(this->sub_columns).
                          super_vector<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>_>_>
                          .
                          super__Vector_base<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->sub_columns).
                          super_vector<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>_>_>
                          .
                          super__Vector_base<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3); __n_00 = __n_00 + 1) {
    this_01 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
              ::get<true>(this_00,__n);
    this_02 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                        (this_01);
    rVar4 = vector<bool,_true>::get<true>(&state->scan_child_column,__n);
    if ((*rVar4._M_p & rVar4._M_mask) == 0) {
      Vector::SetVectorType(this_02,CONSTANT_VECTOR);
      ConstantVector::SetNull(this_02,true);
    }
    else {
      this_03 = vector<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_true>
                ::get<true>(&this->sub_columns,__n);
      pCVar3 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::
               operator->(this_03);
      pvVar1 = vector<duckdb::ColumnScanState,_true>::get<true>(&state->child_states,__n_00);
      (*pCVar3->_vptr_ColumnData[9])
                (pCVar3,vector_index,pvVar1,this_02,target_count,pCVar3->_vptr_ColumnData,
                 transaction.transaction.ptr._0_4_,(undefined4)transaction.transaction_id,
                 transaction.start_time);
    }
  }
  return iVar2;
}

Assistant:

idx_t StructColumnData::Scan(TransactionData transaction, idx_t vector_index, ColumnScanState &state, Vector &result,
                             idx_t target_count) {
	auto scan_count = validity.Scan(transaction, vector_index, state.child_states[0], result, target_count);
	auto &child_entries = StructVector::GetEntries(result);
	for (idx_t i = 0; i < sub_columns.size(); i++) {
		auto &target_vector = *child_entries[i];
		if (!state.scan_child_column[i]) {
			// if we are not scanning this vector - set it to NULL
			target_vector.SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(target_vector, true);
			continue;
		}
		sub_columns[i]->Scan(transaction, vector_index, state.child_states[i + 1], target_vector, target_count);
	}
	return scan_count;
}